

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  char cVar1;
  Rtree *pRtree;
  double dVar2;
  i64 iRowid;
  RtreeSearchPoint *pRVar3;
  sqlite3_vtab *psVar4;
  uint *__src;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  sqlite3_value **ppsVar9;
  sqlite3_uint64 n;
  int local_7c;
  RtreeNode *pRoot;
  int iCell;
  sqlite3_value **local_60;
  sqlite3_vtab_cursor *local_58;
  ulong local_50;
  char *local_48;
  i64 iNode;
  RtreeNode *pLeaf;
  
  pRtree = (Rtree *)pVtabCursor->pVtab;
  pRoot = (RtreeNode *)0x0;
  iCell = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  local_48 = idxStr;
  freeCursorConstraints((RtreeCursor *)pVtabCursor);
  sqlite3_free(pVtabCursor[6].pVtab);
  psVar4 = pVtabCursor[7].pVtab;
  memset(pVtabCursor + 1,0,0x120);
  pVtabCursor->pVtab = (sqlite3_vtab *)pRtree;
  pVtabCursor[7].pVtab = psVar4;
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    iRowid = sqlite3VdbeIntValue(*argv);
    iNode = 0;
    local_7c = findLeafNode(pRtree,iRowid,&pLeaf,&iNode);
    if (pLeaf == (RtreeNode *)0x0 || local_7c != 0) {
      *(undefined1 *)&pVtabCursor[1].pVtab = 1;
    }
    else {
      pRVar3 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
      pVtabCursor[0xb].pVtab = (sqlite3_vtab *)pLeaf;
      pRVar3->id = iNode;
      pRVar3->eWithin = '\x01';
      local_7c = nodeRowidIndex(pRtree,pLeaf,iRowid,&iCell);
      pRVar3->iCell = (u8)iCell;
    }
  }
  else {
    local_60 = argv;
    local_7c = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&pRoot);
    if (argc < 1 || local_7c != 0) {
      if (local_7c != 0) goto LAB_001c4267;
    }
    else {
      local_50 = (ulong)(uint)argc;
      n = local_50 * 0x18;
      psVar4 = (sqlite3_vtab *)sqlite3_malloc64(n);
      pVtabCursor[3].pVtab = psVar4;
      *(int *)&pVtabCursor[2].pVtab = argc;
      local_7c = 7;
      if (psVar4 == (sqlite3_vtab *)0x0) goto LAB_001c4267;
      memset(psVar4,0,n);
      local_58 = pVtabCursor + 0x10;
      memset(local_58,0,(long)pRtree->iDepth * 4 + 4);
      lVar7 = 0x10;
      ppsVar9 = local_60;
      for (uVar8 = 0; local_50 != uVar8; uVar8 = uVar8 + 1) {
        psVar4 = pVtabCursor[3].pVtab;
        cVar1 = local_48[uVar8 * 2];
        *(int *)((long)psVar4 + lVar7 + -0xc) = (int)cVar1;
        *(int *)((long)psVar4 + lVar7 + -0x10) = local_48[uVar8 * 2 + 1] + -0x30;
        if (cVar1 < 0x46) {
          dVar2 = sqlite3VdbeRealValue(ppsVar9[uVar8]);
          *(double *)((long)psVar4 + lVar7 + -8) = dVar2;
        }
        else {
          __src = (uint *)sqlite3_value_pointer(ppsVar9[uVar8],"RtreeMatchArg");
          if (__src == (uint *)0x0) {
            local_7c = 1;
            goto LAB_001c4267;
          }
          puVar5 = (undefined8 *)sqlite3_malloc64((ulong)*__src + 0x70);
          if (puVar5 == (undefined8 *)0x0) goto LAB_001c4267;
          puVar5[0xc] = 0;
          puVar5[0xd] = 0;
          puVar5[10] = 0;
          puVar5[0xb] = 0;
          puVar5[8] = 0;
          puVar5[9] = 0;
          puVar5[6] = 0;
          puVar5[7] = 0;
          puVar5[4] = 0;
          puVar5[5] = 0;
          puVar5[2] = 0;
          puVar5[3] = 0;
          *puVar5 = 0;
          puVar5[1] = 0;
          memcpy(puVar5 + 0xe,__src,(ulong)*__src);
          lVar6 = puVar5[0xf];
          *puVar5 = puVar5[0x12];
          *(undefined4 *)(puVar5 + 1) = *(undefined4 *)(puVar5 + 0x13);
          puVar5[2] = puVar5 + 0x15;
          puVar5[0xd] = puVar5[0x14];
          if (lVar6 == 0) {
            *(undefined4 *)((long)psVar4 + lVar7 + -0xc) = 0x47;
            lVar6 = puVar5[0x10];
          }
          *(long *)((long)psVar4 + lVar7 + -8) = lVar6;
          *(undefined8 **)((long)&psVar4->pModule + lVar7) = puVar5;
          *(uint *)(puVar5 + 7) = (uint)pRtree->nDim2;
          puVar5[6] = local_58;
          *(int *)(puVar5 + 8) = pRtree->iDepth + 1;
          ppsVar9 = local_60;
        }
        lVar7 = lVar7 + 0x18;
      }
    }
    pRVar3 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
    if (pRVar3 == (RtreeSearchPoint *)0x0) {
      return 7;
    }
    pRVar3->id = 1;
    pRVar3->eWithin = '\x01';
    pRVar3->iCell = '\0';
    pVtabCursor[0xb].pVtab = (sqlite3_vtab *)pRoot;
    pRoot = (RtreeNode *)0x0;
    local_7c = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
  }
LAB_001c4267:
  nodeRelease(pRtree,pRoot);
  rtreeRelease(pRtree);
  return local_7c;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;
  sqlite3_stmt *pStmt;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  freeCursorConstraints(pCsr);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array 
    ** with the configured constraints. 
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else{
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}